

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_35995e::ShellTool::configureAttribute
          (ShellTool *this,ConfigureContext *ctx,StringRef name,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> values)

{
  Child LHS;
  Child CVar1;
  Child RHS;
  Twine local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  NodeKind local_48;
  char cStack_47;
  undefined6 uStack_46;
  undefined4 local_40;
  undefined4 uStack_3c;
  NodeKind local_30;
  char cStack_2f;
  undefined6 uStack_2e;
  StringRef local_28;
  
  local_28.Length = name.Length;
  local_28.Data = name.Data;
  llvm::Twine::Twine((Twine *)&local_40,"unexpected attribute: \'",&local_28);
  llvm::Twine::Twine((Twine *)&local_58,"\'");
  if ((local_30 == NullKind) || (local_48 == NullKind)) {
    local_78._16_2_ = 0x100;
  }
  else if (local_30 == EmptyKind) {
    local_78.RHSKind = cStack_47;
    local_78.LHSKind = local_48;
    local_78._18_6_ = uStack_46;
  }
  else if (local_48 == EmptyKind) {
    local_78.RHSKind = cStack_2f;
    local_78.LHSKind = local_30;
    local_78._18_6_ = uStack_2e;
  }
  else {
    LHS._4_4_ = uStack_3c;
    LHS.decUI = local_40;
    if (cStack_2f != '\x01') {
      local_30 = TwineKind;
      LHS.twine = (Twine *)&local_40;
    }
    if (cStack_47 != '\x01') {
      local_48 = TwineKind;
    }
    CVar1._4_4_ = uStack_54;
    CVar1.decUI = local_58;
    RHS.twine = (Twine *)&local_58;
    if (cStack_47 == '\x01') {
      RHS = CVar1;
    }
    llvm::Twine::Twine(&local_78,LHS,local_30,RHS,local_48);
  }
  llbuild::buildsystem::ConfigureContext::error(ctx,&local_78);
  return false;
}

Assistant:

virtual bool configureAttribute(
      const ConfigureContext& ctx, StringRef name,
      ArrayRef<std::pair<StringRef, StringRef>> values) override {
    // No supported attributes.
    ctx.error("unexpected attribute: '" + name + "'");
    return false;
  }